

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void mips_cpu_do_unaligned_access_mips64
               (CPUState *cs,vaddr addr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  uint32_t local_40;
  int local_3c;
  int excp;
  int error_code;
  CPUMIPSState_conflict5 *env;
  MIPSCPU_conflict2 *cpu;
  uintptr_t retaddr_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  vaddr addr_local;
  CPUState *cs_local;
  
  local_3c = 0;
  if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x485c) & 4) == 0) {
    cs[1].tb_jmp_cache[0x20c] = (TranslationBlock *)addr;
  }
  if (access_type == MMU_DATA_STORE) {
    local_40 = 0xd;
  }
  else {
    local_40 = 0xc;
    if (access_type == MMU_INST_FETCH) {
      local_3c = 2;
    }
  }
  do_raise_exception_err_mips64
            ((CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143),local_40,local_3c,retaddr);
}

Assistant:

void mips_cpu_do_unaligned_access(CPUState *cs, vaddr addr,
                                  MMUAccessType access_type,
                                  int mmu_idx, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    int error_code = 0;
    int excp;

    if (!(env->hflags & MIPS_HFLAG_DM)) {
        env->CP0_BadVAddr = addr;
    }

    if (access_type == MMU_DATA_STORE) {
        excp = EXCP_AdES;
    } else {
        excp = EXCP_AdEL;
        if (access_type == MMU_INST_FETCH) {
            error_code |= EXCP_INST_NOTAVAIL;
        }
    }

    do_raise_exception_err(env, excp, error_code, retaddr);
}